

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O2

void __thiscall bal::Formula::add_parameter(Formula *this,string *key,string *name,uint32_t value)

{
  string local_40;
  
  std::__cxx11::to_string(&local_40,value);
  add_parameter(this,key,name,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Formula::add_parameter(const std::string& key, const std::string& name, const uint32_t value) {
        add_parameter(key, name, std::to_string(value), false);
    }